

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

string * __thiscall
es32cts::RobustBufferAccessBehavior::TexelFetchTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,TexelFetchTest *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 320 es\n\nvoid main()\n{\n    gl_Position = vec4(0, 0, 0, 1);\n}\n\n","");
  return __return_storage_ptr__;
}

Assistant:

std::string TexelFetchTest::getVertexShader()
{
	return std::string("#version 320 es\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    gl_Position = vec4(0, 0, 0, 1);\n"
					   "}\n"
					   "\n");
}